

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>_>
              *this,void *pointer)

{
  long lVar1;
  long *plVar2;
  
  if (pointer != (void *)0x0) {
    plVar2 = *(long **)((long)pointer + 0x228);
    if (plVar2 != (long *)0x0) {
      lVar1 = *(long *)((long)pointer + 0x220);
      if (lVar1 == 0) {
        *(long **)(*(long *)((long)pointer + 0x208) + 0x30) = plVar2;
      }
      else {
        *(long **)(lVar1 + 0x20) = plVar2;
        plVar2 = *(long **)((long)pointer + 0x228);
      }
      *plVar2 = lVar1;
    }
    if (*(char *)((long)pointer + 0x18) == '\x01') {
      Exception::~Exception((Exception *)((long)pointer + 0x20));
    }
  }
  operator_delete(pointer,0x230);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }